

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractRoomAction.cpp
# Opt level: O0

ActionResults * __thiscall AbstractRoomAction::Throw(AbstractRoomAction *this)

{
  ItemTable *pIVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ItemWrapper *this_00;
  string local_108 [36];
  itemType local_e4;
  itemType local_e0;
  itemType local_dc;
  undefined1 local_d8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  undefined4 local_78;
  undefined1 local_71;
  string local_70 [52];
  itemType local_3c;
  string local_38 [8];
  string information;
  AbstractRoomAction *this_local;
  
  std::__cxx11::string::string(local_38);
  pIVar1 = this->itemList;
  local_3c = Command::getMainItem(this->commands);
  pIVar3 = ItemTable::getValue(pIVar1,&local_3c);
  iVar2 = ItemWrapper::getLocation(pIVar3);
  if (iVar2 == BACKPACK) {
    pIVar1 = this->itemList;
    local_dc = Command::getMainItem(this->commands);
    ItemTable::getValue(pIVar1,&local_dc);
    ItemWrapper::getItemName_abi_cxx11_((ItemWrapper *)local_d8);
    std::operator+(local_d8 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "You throw the  ");
    std::operator+(local_98,local_d8 + 0x20);
    std::__cxx11::string::operator=(local_38,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)(local_d8 + 0x20));
    std::__cxx11::string::~string((string *)local_d8);
    pIVar1 = this->itemList;
    local_e0 = Command::getMainItem(this->commands);
    pIVar3 = ItemTable::getValue(pIVar1,&local_e0);
    local_e4 = PLAYER;
    this_00 = ItemTable::getValue(this->itemList,&local_e4);
    iVar2 = ItemWrapper::getLocation(this_00);
    ItemWrapper::setLocation(pIVar3,iVar2);
    this_local = (AbstractRoomAction *)operator_new(0x30);
    std::__cxx11::string::string(local_108,local_38);
    ActionResults::ActionResults((ActionResults *)this_local,CURRENT,(string *)local_108);
    std::__cxx11::string::~string(local_108);
  }
  else {
    std::__cxx11::string::operator=
              (local_38,
               "You can not throw an item that you do not currently have in your backpack. Pick up item in order to throw it."
              );
    this_local = (AbstractRoomAction *)operator_new(0x30);
    local_71 = 1;
    std::__cxx11::string::string(local_70,local_38);
    ActionResults::ActionResults((ActionResults *)this_local,CURRENT,(string *)local_70);
    local_71 = 0;
    std::__cxx11::string::~string(local_70);
  }
  local_78 = 1;
  std::__cxx11::string::~string(local_38);
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * AbstractRoomAction::Throw() {

    std::string information;

    if (itemList->getValue(commands->getMainItem())->getLocation() != BACKPACK) {
        information = "You can not throw an item that you do not currently "
                "have in your backpack. Pick up item in order to throw it.";
        return new ActionResults(CURRENT, information);
    }

    information = "You throw the  " + itemList->getValue(commands->getMainItem())->getItemName() + " to the ground";
    itemList->getValue(commands->getMainItem())->setLocation(itemList->getValue(PLAYER)->getLocation());

    return new ActionResults(CURRENT, information);
}